

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::setRootIndex(QListView *this,QModelIndex *index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar3 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x80))();
  iVar2 = iVar3 + -1;
  if (*(int *)(lVar1 + 0x590) < iVar3 + -1) {
    iVar2 = *(int *)(lVar1 + 0x590);
  }
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  *(int *)(lVar1 + 0x590) = iVar3;
  QAbstractItemView::setRootIndex((QAbstractItemView *)this,index);
  *(undefined8 *)(lVar1 + 0x598) = 0xffffffffffffffff;
  (**(code **)(**(long **)(lVar1 + 0x540) + 0x28))();
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear
            ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x588));
  return;
}

Assistant:

void QListView::setRootIndex(const QModelIndex &index)
{
    Q_D(QListView);
    d->column = qMax(0, qMin(d->column, d->model->columnCount(index) - 1));
    QAbstractItemView::setRootIndex(index);
    // sometimes we get an update before reset() is called
    d->clear();
    d->hiddenRows.clear();
}